

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O0

Amap_Obj_t * Amap_ManCreateAnd(Amap_Man_t *p,Amap_Obj_t *pFan0,Amap_Obj_t *pFan1)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Amap_Obj_t *pAVar5;
  Amap_Obj_t *pAVar6;
  Amap_Obj_t *pObj;
  Amap_Obj_t *pFan1_local;
  Amap_Obj_t *pFan0_local;
  Amap_Man_t *p_local;
  
  pAVar5 = Amap_ManSetupObj(p);
  *(ulong *)pAVar5 = *(ulong *)pAVar5 & 0xfffffffffffffff8 | 4;
  iVar1 = Amap_ObjToLit(pFan0);
  pAVar5->Fan[0] = iVar1;
  pAVar6 = Amap_Regular(pFan0);
  pAVar6->nRefs = pAVar6->nRefs + 1;
  iVar1 = Amap_ObjToLit(pFan1);
  pAVar5->Fan[1] = iVar1;
  pAVar6 = Amap_Regular(pFan1);
  pAVar6->nRefs = pAVar6->nRefs + 1;
  iVar1 = Abc_Lit2Var(pAVar5->Fan[0]);
  iVar2 = Abc_Lit2Var(pAVar5->Fan[1]);
  if (iVar1 == iVar2) {
    __assert_fail("Abc_Lit2Var(pObj->Fan[0]) != Abc_Lit2Var(pObj->Fan[1])",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapGraph.c"
                  ,0x90,"Amap_Obj_t *Amap_ManCreateAnd(Amap_Man_t *, Amap_Obj_t *, Amap_Obj_t *)");
  }
  uVar3 = Amap_ObjPhaseReal(pFan0);
  uVar4 = Amap_ObjPhaseReal(pFan1);
  *(ulong *)pAVar5 = *(ulong *)pAVar5 & 0xdfffffffffffffff | ((ulong)(uVar3 & uVar4) & 1) << 0x3d;
  pAVar6 = Amap_Regular(pFan0);
  uVar3 = pAVar6->Level;
  pAVar6 = Amap_Regular(pFan1);
  iVar1 = Abc_MaxInt(uVar3,pAVar6->Level);
  pAVar5->Level = iVar1 + 1;
  if (p->nLevelMax < (int)pAVar5->Level) {
    p->nLevelMax = pAVar5->Level;
  }
  if (p->nLevelMax < 0xffe) {
    p->nObjs[4] = p->nObjs[4] + 1;
    return pAVar5;
  }
  __assert_fail("p->nLevelMax < 4094",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapGraph.c"
                ,0x95,"Amap_Obj_t *Amap_ManCreateAnd(Amap_Man_t *, Amap_Obj_t *, Amap_Obj_t *)");
}

Assistant:

Amap_Obj_t * Amap_ManCreateAnd( Amap_Man_t * p, Amap_Obj_t * pFan0, Amap_Obj_t * pFan1 )
{
    Amap_Obj_t * pObj;
    pObj = Amap_ManSetupObj( p );
    pObj->Type   = AMAP_OBJ_AND;
    pObj->Fan[0] = Amap_ObjToLit(pFan0);  Amap_Regular(pFan0)->nRefs++;
    pObj->Fan[1] = Amap_ObjToLit(pFan1);  Amap_Regular(pFan1)->nRefs++;
    assert( Abc_Lit2Var(pObj->Fan[0]) != Abc_Lit2Var(pObj->Fan[1]) );
    pObj->fPhase = Amap_ObjPhaseReal(pFan0) & Amap_ObjPhaseReal(pFan1);
    pObj->Level  = 1 + Abc_MaxInt( Amap_Regular(pFan0)->Level, Amap_Regular(pFan1)->Level );
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    assert( p->nLevelMax < 4094 ); // 2^12-2
    p->nObjs[AMAP_OBJ_AND]++;
    return pObj;
}